

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::Camera(ParsedScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  FileLoc loc_00;
  Float (*paFVar1) [4];
  mapped_type *pmVar2;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  ParameterDictionary dict;
  TransformSet cameraFromWorld;
  TransformSet worldFromCamera;
  CameraTransform cameraTransform;
  allocator<char> local_a99;
  ParameterDictionary local_a98;
  ParameterDictionary local_a30;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_9c8;
  TransformSet local_968;
  TransformSet local_860;
  undefined1 local_760 [704];
  ParsedParameter *pPStack_4a0;
  ParsedParameter *pPStack_498;
  ParsedParameter *pPStack_490;
  ParsedParameter *pPStack_488;
  ParsedParameter *pPStack_480;
  size_t sStack_478;
  size_t sStack_470;
  pointer local_468;
  size_type sStack_460;
  size_type sStack_458;
  Float aFStack_450 [2];
  memory_resource *pmStack_448;
  ParsedParameter **ppPStack_440;
  ParsedParameter *pPStack_438;
  ParsedParameter *pPStack_430;
  CameraSceneEntity local_428;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_9c8,in_RDX);
  ParameterDictionary::ParameterDictionary(&local_a30,&local_9c8,(this->graphicsState).colorSpace);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_9c8);
  if (this->currentBlock != WorldBlock) {
    local_968.t[0].m.m[0]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[0];
    local_968.t[0].m.m[0]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[0] + 2);
    local_968.t[0].m.m[1]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[1];
    local_968.t[0].m.m[1]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[1] + 2);
    local_968.t[0].m.m[2]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[2];
    local_968.t[0].m.m[2]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[2] + 2);
    local_968.t[0].m.m[3]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].m.m[3];
    local_968.t[0].m.m[3]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].m.m[3] + 2);
    local_968.t[0].mInv.m[0]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[0];
    local_968.t[0].mInv.m[0]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[0] + 2);
    local_968.t[0].mInv.m[1]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[1];
    local_968.t[0].mInv.m[1]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[1] + 2);
    local_968.t[0].mInv.m[2]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[2];
    local_968.t[0].mInv.m[2]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[2] + 2);
    local_968.t[0].mInv.m[3]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[0].mInv.m[3];
    local_968.t[0].mInv.m[3]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[0].mInv.m[3] + 2);
    local_968.t[1].m.m[0]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[0];
    local_968.t[1].m.m[0]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[0] + 2);
    local_968.t[1].m.m[1]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[1];
    local_968.t[1].m.m[1]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[1] + 2);
    local_968.t[1].m.m[2]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[2];
    local_968.t[1].m.m[2]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[2] + 2);
    local_968.t[1].m.m[3]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].m.m[3];
    local_968.t[1].m.m[3]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].m.m[3] + 2);
    local_968.t[1].mInv.m[0]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[0];
    local_968.t[1].mInv.m[0]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[0] + 2);
    local_968.t[1].mInv.m[1]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[1];
    local_968.t[1].mInv.m[1]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[1] + 2);
    local_968.t[1].mInv.m[2]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[2];
    local_968.t[1].mInv.m[2]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[2] + 2);
    local_968.t[1].mInv.m[3]._0_8_ = *(undefined8 *)(this->graphicsState).ctm.t[1].mInv.m[3];
    local_968.t[1].mInv.m[3]._8_8_ = *(undefined8 *)((this->graphicsState).ctm.t[1].mInv.m[3] + 2);
    Inverse(&local_860,&(this->graphicsState).ctm);
    Inverse((TransformSet *)&local_428,&local_968);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_760,"camera",&local_a99);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
             ::operator[](&this->namedCoordinateSystems,(key_type *)local_760);
    *(undefined8 *)pmVar2->t[1].mInv.m[0] =
         local_428.cameraTransform.renderFromCamera.startTransform.m.m[2]._0_8_;
    *(undefined8 *)(pmVar2->t[1].mInv.m[0] + 2) =
         local_428.cameraTransform.renderFromCamera.startTransform.m.m[2]._8_8_;
    *(undefined8 *)pmVar2->t[1].mInv.m[1] =
         local_428.cameraTransform.renderFromCamera.startTransform.m.m[3]._0_8_;
    *(undefined8 *)(pmVar2->t[1].mInv.m[1] + 2) =
         local_428.cameraTransform.renderFromCamera.startTransform.m.m[3]._8_8_;
    *(undefined8 *)pmVar2->t[1].mInv.m[2] =
         local_428.cameraTransform.renderFromCamera.startTransform.mInv.m[0]._0_8_;
    *(undefined8 *)(pmVar2->t[1].mInv.m[2] + 2) =
         local_428.cameraTransform.renderFromCamera.startTransform.mInv.m[0]._8_8_;
    *(undefined8 *)pmVar2->t[1].mInv.m[3] =
         local_428.cameraTransform.renderFromCamera.startTransform.mInv.m[1]._0_8_;
    *(undefined8 *)(pmVar2->t[1].mInv.m[3] + 2) =
         local_428.cameraTransform.renderFromCamera.startTransform.mInv.m[1]._8_8_;
    *(RGBColorSpace **)pmVar2->t[1].m.m[0] = local_428.super_SceneEntity.parameters.colorSpace;
    *(size_t *)(pmVar2->t[1].m.m[0] + 2) = local_428.super_SceneEntity.loc.filename._M_len;
    *(char **)pmVar2->t[1].m.m[1] = local_428.super_SceneEntity.loc.filename._M_str;
    paFVar1 = pmVar2->t[1].m.m;
    *(int *)((long)(paFVar1 + 1) + 8) = local_428.super_SceneEntity.loc.line;
    *(int *)((long)(paFVar1 + 1) + 0xc) = local_428.super_SceneEntity.loc.column;
    *(undefined8 *)pmVar2->t[1].m.m[2] =
         local_428.cameraTransform.renderFromCamera.startTransform.m.m[0]._0_8_;
    *(undefined8 *)(pmVar2->t[1].m.m[2] + 2) =
         local_428.cameraTransform.renderFromCamera.startTransform.m.m[0]._8_8_;
    *(undefined8 *)pmVar2->t[1].m.m[3] =
         local_428.cameraTransform.renderFromCamera.startTransform.m.m[1]._0_8_;
    *(undefined8 *)(pmVar2->t[1].m.m[3] + 2) =
         local_428.cameraTransform.renderFromCamera.startTransform.m.m[1]._8_8_;
    *(ParsedParameter **)pmVar2->t[0].mInv.m[0] =
         local_428.super_SceneEntity.parameters.params.field_2.fixed[2];
    *(ParsedParameter **)(pmVar2->t[0].mInv.m[0] + 2) =
         local_428.super_SceneEntity.parameters.params.field_2.fixed[3];
    *(ParsedParameter **)pmVar2->t[0].mInv.m[1] =
         local_428.super_SceneEntity.parameters.params.field_2.fixed[4];
    *(ParsedParameter **)(pmVar2->t[0].mInv.m[1] + 2) =
         local_428.super_SceneEntity.parameters.params.field_2.fixed[5];
    *(ParsedParameter **)pmVar2->t[0].mInv.m[2] =
         local_428.super_SceneEntity.parameters.params.field_2.fixed[6];
    *(ParsedParameter **)(pmVar2->t[0].mInv.m[2] + 2) =
         local_428.super_SceneEntity.parameters.params.field_2.fixed[7];
    *(size_t *)pmVar2->t[0].mInv.m[3] = local_428.super_SceneEntity.parameters.params.nAlloc;
    *(size_t *)(pmVar2->t[0].mInv.m[3] + 2) = local_428.super_SceneEntity.parameters.params.nStored;
    *(pointer *)pmVar2->t[0].m.m[0] = local_428.super_SceneEntity.name._M_dataplus._M_p;
    *(size_type *)(pmVar2->t[0].m.m[0] + 2) = local_428.super_SceneEntity.name._M_string_length;
    *(size_type *)pmVar2->t[0].m.m[1] =
         local_428.super_SceneEntity.name.field_2._M_allocated_capacity;
    *(undefined8 *)(pmVar2->t[0].m.m[1] + 2) = local_428.super_SceneEntity.name.field_2._8_8_;
    *(memory_resource **)pmVar2->t[0].m.m[2] =
         local_428.super_SceneEntity.parameters.params.alloc.memoryResource;
    *(ParsedParameter ***)(pmVar2->t[0].m.m[2] + 2) =
         local_428.super_SceneEntity.parameters.params.ptr;
    *(ParsedParameter **)pmVar2->t[0].m.m[3] =
         local_428.super_SceneEntity.parameters.params.field_2.fixed[0];
    *(ParsedParameter **)(pmVar2->t[0].m.m[3] + 2) =
         local_428.super_SceneEntity.parameters.params.field_2.fixed[1];
    std::__cxx11::string::~string((string *)local_760);
    AnimatedTransform::AnimatedTransform
              ((AnimatedTransform *)&local_428,local_860.t,(this->graphicsState).transformStartTime,
               local_860.t + 1,(this->graphicsState).transformEndTime);
    CameraTransform::CameraTransform((CameraTransform *)local_760,(AnimatedTransform *)&local_428);
    local_428.super_SceneEntity.name._M_dataplus._M_p = local_468;
    local_428.super_SceneEntity.name._M_string_length = sStack_460;
    local_428.super_SceneEntity.name.field_2._M_allocated_capacity = sStack_458;
    local_428.super_SceneEntity.name.field_2._8_4_ = aFStack_450[0];
    local_428.super_SceneEntity.name.field_2._12_4_ = aFStack_450[1];
    local_428.super_SceneEntity.parameters.params.alloc.memoryResource = pmStack_448;
    local_428.super_SceneEntity.parameters.params.ptr = ppPStack_440;
    local_428.super_SceneEntity.parameters.params.field_2.fixed[0] = pPStack_438;
    local_428.super_SceneEntity.parameters.params.field_2.fixed[1] = pPStack_430;
    local_428.super_SceneEntity.parameters.params.field_2.fixed[2] =
         (ParsedParameter *)local_760._696_8_;
    local_428.super_SceneEntity.parameters.params.field_2.fixed[3] = pPStack_4a0;
    local_428.super_SceneEntity.parameters.params.field_2.fixed[4] = pPStack_498;
    local_428.super_SceneEntity.parameters.params.field_2.fixed[5] = pPStack_490;
    local_428.super_SceneEntity.parameters.params.field_2.fixed[6] = pPStack_488;
    local_428.super_SceneEntity.parameters.params.field_2.fixed[7] = pPStack_480;
    local_428.super_SceneEntity.parameters.params.nAlloc = sStack_478;
    local_428.super_SceneEntity.parameters.params.nStored = sStack_470;
    *(undefined8 *)(this->renderFromWorld).mInv.m[0] = local_760._696_8_;
    *(ParsedParameter **)((this->renderFromWorld).mInv.m[0] + 2) = pPStack_4a0;
    *(ParsedParameter **)(this->renderFromWorld).mInv.m[1] = pPStack_498;
    *(ParsedParameter **)((this->renderFromWorld).mInv.m[1] + 2) = pPStack_490;
    *(ParsedParameter **)(this->renderFromWorld).mInv.m[2] = pPStack_488;
    *(ParsedParameter **)((this->renderFromWorld).mInv.m[2] + 2) = pPStack_480;
    *(size_t *)(this->renderFromWorld).mInv.m[3] = sStack_478;
    *(size_t *)((this->renderFromWorld).mInv.m[3] + 2) = sStack_470;
    *(pointer *)(this->renderFromWorld).m.m[0] = local_468;
    *(size_type *)((this->renderFromWorld).m.m[0] + 2) = sStack_460;
    *(size_type *)(this->renderFromWorld).m.m[1] = sStack_458;
    *(Float (*) [2])((this->renderFromWorld).m.m[1] + 2) = aFStack_450;
    *(memory_resource **)(this->renderFromWorld).m.m[2] = pmStack_448;
    *(ParsedParameter ***)((this->renderFromWorld).m.m[2] + 2) = ppPStack_440;
    *(ParsedParameter **)(this->renderFromWorld).m.m[3] = pPStack_438;
    *(ParsedParameter **)((this->renderFromWorld).m.m[3] + 2) = pPStack_430;
    ParameterDictionary::ParameterDictionary(&local_a98,&local_a30);
    loc_00.filename._M_str = (char *)params.ptr;
    loc_00.filename._M_len = (size_t)params.alloc.memoryResource;
    loc_00._16_8_ = params.field_2.fixed[0];
    CameraSceneEntity::CameraSceneEntity
              (&local_428,name,&local_a98,loc_00,(CameraTransform *)local_760,
               &(this->graphicsState).currentOutsideMedium);
    CameraSceneEntity::operator=(&this->camera,&local_428);
    CameraSceneEntity::~CameraSceneEntity(&local_428);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_a98.params);
    InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
    ::~InlinedVector(&local_a30.params);
    return;
  }
  ErrorExit<char_const(&)[7]>
            ((FileLoc *)&params,"Options cannot be set inside world block; \"%s\" is not allowed.",
             (char (*) [7])0x53f01e);
}

Assistant:

void ParsedScene::Camera(const std::string &name, ParsedParameterVector params,
                         FileLoc loc) {
    ParameterDictionary dict(std::move(params), graphicsState.colorSpace);

    VERIFY_OPTIONS("Camera");

    TransformSet cameraFromWorld = graphicsState.ctm;
    TransformSet worldFromCamera = Inverse(graphicsState.ctm);
    namedCoordinateSystems["camera"] = Inverse(cameraFromWorld);

    CameraTransform cameraTransform(
        AnimatedTransform(worldFromCamera[0], graphicsState.transformStartTime,
                          worldFromCamera[1], graphicsState.transformEndTime));
    renderFromWorld = cameraTransform.RenderFromWorld();

    camera = CameraSceneEntity(name, std::move(dict), loc, cameraTransform,
                               graphicsState.currentOutsideMedium);
}